

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cffgload.c
# Opt level: O0

FT_Error cff_slot_load(CFF_GlyphSlot glyph,CFF_Size size,FT_UInt glyph_index,FT_Int32 load_flags)

{
  TT_Face face_00;
  void *pvVar1;
  void *pvVar2;
  undefined8 *puVar3;
  FT_Face pFVar4;
  long lVar5;
  FT_Slot_Internal pFVar6;
  int iVar7;
  FT_Int32 FVar8;
  FT_Int32 FVar9;
  FT_Long FVar10;
  CFF_GlyphSlot length;
  CFF_Size extraout_RDX;
  CFF_Size extraout_RDX_00;
  CFF_Size extraout_RDX_01;
  CFF_Size pCVar11;
  FT_Int32 b;
  TT_Face pointer;
  FT_Bool FVar12;
  bool bVar13;
  bool bVar14;
  bool local_c4a;
  bool local_c49;
  FT_Fixed y_scale;
  FT_Fixed x_scale;
  FT_Vector *vec;
  FT_Outline *cur;
  FT_Int n;
  short local_c1c;
  FT_UShort vertAdvance;
  FT_Short vertBearingY;
  FT_UShort horiAdvance;
  FT_Short horiBearingX;
  FT_Bool has_vertical_info_1;
  FT_Glyph_Metrics *metrics_2;
  FT_BBox cbox;
  FT_Slot_Internal internal;
  FT_Incremental_MetricsRec metrics_1;
  CFF_Index csindex;
  FT_ULong charstring_len;
  FT_Byte *charstring;
  long lStack_ba8;
  FT_Byte fd_index;
  FT_Long sub_upm;
  FT_Long top_upm;
  ushort local_b90;
  FT_Short dummy;
  FT_UShort advance;
  short sStack_b8a;
  FT_Bool has_vertical_info;
  TT_SBit_MetricsRec metrics;
  FT_Stream stream;
  SFNT_Service sfnt;
  CFF_Face cff_face;
  FT_Vector font_offset;
  FT_Matrix font_matrix;
  CFF_Decoder_Funcs decoder_funcs;
  PSAux_Service psaux;
  CFF_Font_conflict cff;
  FT_Bool force_scaling;
  FT_Bool scaled;
  FT_Bool hinting;
  TT_Face face;
  PS_Decoder psdecoder;
  CFF_Decoder decoder;
  uint local_28;
  FT_Error error;
  FT_Int32 load_flags_local;
  FT_UInt glyph_index_local;
  CFF_Size size_local;
  CFF_GlyphSlot glyph_local;
  
  face_00 = (TT_Face)(glyph->root).face;
  pvVar1 = (face_00->extra).data;
  pvVar2 = face_00->psaux;
  puVar3 = *(undefined8 **)((long)pvVar2 + 0x50);
  bVar13 = false;
  error = glyph_index;
  if ((*(int *)((long)pvVar1 + 0x74c) == 0xffff) || (*(long *)((long)pvVar1 + 0x528) == 0)) {
    if (*(uint *)((long)pvVar1 + 0x24) <= glyph_index) {
      return 6;
    }
  }
  else if ((glyph_index != 0) &&
          (error = cff_charset_cid_to_gindex((CFF_Charset)((long)pvVar1 + 0x510),glyph_index),
          error == 0)) {
    return 6;
  }
  local_28 = load_flags;
  if ((load_flags & 0x400U) != 0) {
    local_28 = load_flags | 3;
  }
  glyph->x_scale = 0x10000;
  glyph->y_scale = 0x10000;
  if (size != (CFF_Size)0x0) {
    glyph->x_scale = (size->root).metrics.x_scale;
    glyph->y_scale = (size->root).metrics.y_scale;
    pFVar4 = (size->root).face;
    lVar5 = *(long *)&pFVar4[3].units_per_EM;
    metrics._8_8_ = pFVar4->stream;
    if ((((size->strike_index != 0xffffffff) && (*(long *)(lVar5 + 0xc0) != 0)) &&
        ((local_28 & 8) == 0)) &&
       (iVar7 = (**(code **)(lVar5 + 0x90))
                          (face_00,size->strike_index,error,local_28,metrics._8_8_,
                           &(glyph->root).bitmap,&local_b90), iVar7 == 0)) {
      (glyph->root).outline.n_points = 0;
      (glyph->root).outline.n_contours = 0;
      (glyph->root).metrics.width = (ulong)(ushort)dummy << 6;
      (glyph->root).metrics.height = (ulong)local_b90 << 6;
      (glyph->root).metrics.horiBearingX = (long)(short)advance << 6;
      (glyph->root).metrics.horiBearingY = (long)sStack_b8a << 6;
      (glyph->root).metrics.horiAdvance = (ulong)metrics.height << 6;
      (glyph->root).metrics.vertBearingX = (long)(short)metrics.width << 6;
      (glyph->root).metrics.vertBearingY = (long)metrics.horiBearingX << 6;
      (glyph->root).metrics.vertAdvance = (ulong)(ushort)metrics.horiBearingY << 6;
      (glyph->root).format = FT_GLYPH_FORMAT_BITMAP;
      if ((local_28 & 0x10) == 0) {
        (glyph->root).bitmap_left = (int)(short)advance;
        (glyph->root).bitmap_top = (int)sStack_b8a;
      }
      else {
        (glyph->root).bitmap_left = (int)(short)metrics.width;
        (glyph->root).bitmap_top = (int)metrics.horiBearingX;
      }
      (**(code **)((long)face_00->sfnt + 0xe0))
                (face_00,0,error,(long)&top_upm + 2,(long)&top_upm + 4);
      (glyph->root).linearHoriAdvance = (ulong)top_upm._4_2_;
      local_c49 = false;
      if (face_00->vertical_info != '\0') {
        local_c49 = (face_00->vertical).number_Of_VMetrics != 0;
      }
      top_upm._7_1_ = local_c49;
      if (local_c49 == false) {
        if ((face_00->os2).version == 0xffff) {
          (glyph->root).linearVertAdvance =
               (long)((int)(face_00->horizontal).Ascender - (int)(face_00->horizontal).Descender);
        }
        else {
          (glyph->root).linearVertAdvance =
               (long)((int)(face_00->os2).sTypoAscender - (int)(face_00->os2).sTypoDescender);
        }
      }
      else {
        (**(code **)((long)face_00->sfnt + 0xe0))
                  (face_00,1,error,(long)&top_upm + 2,(long)&top_upm + 4);
        (glyph->root).linearVertAdvance = (ulong)top_upm._4_2_;
      }
      return 0;
    }
  }
  if ((local_28 & 0x4000) == 0) {
    if (*(int *)((long)pvVar1 + 0xb30) == 0) {
      font_offset.y = *(FT_Pos *)((long)pvVar1 + 0x6a8);
      font_matrix.xx = *(FT_Fixed *)((long)pvVar1 + 0x6b0);
      font_matrix.xy = *(FT_Fixed *)((long)pvVar1 + 0x6b8);
      font_matrix.yx = *(FT_Fixed *)((long)pvVar1 + 0x6c0);
      cff_face = *(CFF_Face *)((long)pvVar1 + 0x6d8);
      font_offset.x = *(FT_Pos *)((long)pvVar1 + 0x6e0);
    }
    else {
      charstring._7_1_ = cff_fd_select_get((CFF_FDSelect)((long)pvVar1 + 0x1338),error);
      if (*(uint *)((long)pvVar1 + 0xb30) <= (uint)charstring._7_1_) {
        charstring._7_1_ = (char)*(undefined4 *)((long)pvVar1 + 0xb30) - 1;
      }
      sub_upm = *(long *)((long)pvVar1 + 0x6d0);
      lStack_ba8 = *(long *)(*(long *)((long)pvVar1 + (ulong)charstring._7_1_ * 8 + 0xb38) + 0x68);
      lVar5 = *(long *)((long)pvVar1 + (ulong)charstring._7_1_ * 8 + 0xb38);
      font_offset.y = *(FT_Pos *)(lVar5 + 0x40);
      font_matrix.xx = *(FT_Fixed *)(lVar5 + 0x48);
      font_matrix.xy = *(FT_Fixed *)(lVar5 + 0x50);
      font_matrix.yx = *(FT_Fixed *)(lVar5 + 0x58);
      lVar5 = *(long *)((long)pvVar1 + (ulong)charstring._7_1_ * 8 + 0xb38);
      cff_face = *(CFF_Face *)(lVar5 + 0x70);
      font_offset.x = *(FT_Pos *)(lVar5 + 0x78);
      bVar13 = sub_upm != lStack_ba8;
      if (bVar13) {
        FVar10 = FT_MulDiv(glyph->x_scale,sub_upm,lStack_ba8);
        glyph->x_scale = FVar10;
        FVar10 = FT_MulDiv(glyph->y_scale,sub_upm,lStack_ba8);
        glyph->y_scale = FVar10;
      }
    }
    (glyph->root).outline.n_points = 0;
    (glyph->root).outline.n_contours = 0;
    cff._7_1_ = (local_28 & 2) == 0;
    glyph->hint = cff._7_1_;
    glyph->scaled = (local_28 & 1) == 0;
    (glyph->root).format = FT_GLYPH_FORMAT_OUTLINE;
    FVar12 = cff._7_1_;
    (*(code *)*puVar3)(&psdecoder.len_buildchar,face_00,size,glyph,cff._7_1_,
                       (int)local_28 >> 0x10 & 0xf,cff_get_glyph_data,cff_free_glyph_data);
    pointer = (TT_Face)(ulong)(uint)error;
    length = (CFF_GlyphSlot)&csindex;
    decoder.free_glyph_callback._4_4_ =
         cff_get_glyph_data(face_00,error,(FT_Byte **)&charstring_len,(FT_ULong *)length);
    pCVar11 = extraout_RDX;
    if ((decoder.free_glyph_callback._4_4_ == 0) &&
       (pointer = (TT_Face)size,
       decoder.free_glyph_callback._4_4_ = (*(code *)puVar3[1])(&psdecoder.len_buildchar,size,error)
       , pCVar11 = extraout_RDX_00, decoder.free_glyph_callback._4_4_ == 0)) {
      (**(code **)((long)pvVar2 + 0x30))(&face,&psdecoder.len_buildchar,0);
      decoder.free_glyph_callback._4_4_ = (*(code *)puVar3[2])(&face,charstring_len,csindex);
      bVar14 = (decoder.free_glyph_callback._4_4_ & 0xff) == 0xa4;
      if (bVar14) {
        bVar13 = true;
        length = (CFF_GlyphSlot)((ulong)length & 0xffffffffffffff00);
        glyph->hint = '\0';
        decoder.free_glyph_callback._4_4_ = (*(code *)puVar3[2])(&face,charstring_len,csindex);
      }
      cff._7_1_ = !bVar14 && cff._7_1_;
      pointer = (TT_Face)&charstring_len;
      cff_free_glyph_data(face_00,(FT_Byte **)pointer,(FT_ULong)csindex);
      pCVar11 = extraout_RDX_01;
      if (decoder.free_glyph_callback._4_4_ == 0) {
        if (((face_00->root).internal)->incremental_interface == (FT_Incremental_InterfaceRec *)0x0)
        {
          metrics_1.advance_v = (long)pvVar1 + 0x538;
          if (*(long *)((long)pvVar1 + 0x568) != 0) {
            pCVar11 = (CFF_Size)(ulong)(uint)error;
            (glyph->root).control_data =
                 (void *)(*(long *)((long)pvVar1 + 0x570) +
                          *(long *)(*(long *)((long)pvVar1 + 0x568) + (long)pCVar11 * 8) + -1);
            (glyph->root).control_len = (long)csindex;
            length = (CFF_GlyphSlot)csindex;
          }
        }
        else {
          (glyph->root).control_data = (void *)0x0;
          (glyph->root).control_len = 0;
        }
      }
    }
    if (((decoder.free_glyph_callback._4_4_ == 0) &&
        ((*decoder.builder.funcs.init)
                   ((CFF_Builder *)&psdecoder.len_buildchar,pointer,pCVar11,length,FVar12),
        ((face_00->root).internal)->incremental_interface != (FT_Incremental_InterfaceRec *)0x0)) &&
       (((face_00->root).internal)->incremental_interface->funcs->get_glyph_metrics !=
        (FT_Incremental_GetGlyphMetricsFunc)0x0)) {
      internal = (FT_Slot_Internal)decoder.builder.pos_y;
      metrics_1.bearing_x = 0;
      decoder.free_glyph_callback._4_4_ =
           (*((face_00->root).internal)->incremental_interface->funcs->get_glyph_metrics)
                     (((face_00->root).internal)->incremental_interface->object,error,'\0',
                      (FT_Incremental_MetricsRec *)&internal);
      decoder.builder.pos_y = (FT_Pos)internal;
    }
    if (decoder.free_glyph_callback._4_4_ == 0) {
      if ((local_28 & 0x400) == 0) {
        _vertBearingY = &(glyph->root).metrics;
        if ((face_00->horizontal).number_Of_HMetrics == 0) {
          (glyph->root).metrics.horiAdvance = decoder.flex_vectors[6].y;
          (glyph->root).linearHoriAdvance = decoder.flex_vectors[6].y;
        }
        else {
          local_c1c = 0;
          n._2_2_ = 0;
          (**(code **)((long)face_00->sfnt + 0xe0))(face_00,0,error,&local_c1c,(long)&n + 2);
          _vertBearingY->horiAdvance = (ulong)n._2_2_;
          _vertBearingY->horiBearingX = (long)local_c1c;
          (glyph->root).linearHoriAdvance = (ulong)n._2_2_;
        }
        ((glyph->root).internal)->glyph_transformed = '\0';
        local_c4a = false;
        if (face_00->vertical_info != '\0') {
          local_c4a = (face_00->vertical).number_Of_VMetrics != 0;
        }
        vertAdvance._1_1_ = local_c4a;
        if (local_c4a == false) {
          if ((face_00->os2).version == 0xffff) {
            _vertBearingY->vertAdvance =
                 (long)((int)(face_00->horizontal).Ascender - (int)(face_00->horizontal).Descender);
          }
          else {
            _vertBearingY->vertAdvance =
                 (long)((int)(face_00->os2).sTypoAscender - (int)(face_00->os2).sTypoDescender);
          }
        }
        else {
          n._0_2_ = 0;
          cur._6_2_ = 0;
          (**(code **)((long)face_00->sfnt + 0xe0))(face_00,1,error,&n,(long)&cur + 6);
          _vertBearingY->vertBearingY = (long)(short)n;
          _vertBearingY->vertAdvance = (ulong)cur._6_2_;
        }
        (glyph->root).linearVertAdvance = _vertBearingY->vertAdvance;
        (glyph->root).format = FT_GLYPH_FORMAT_OUTLINE;
        (glyph->root).outline.flags = 0;
        if ((size != (CFF_Size)0x0) && ((size->root).metrics.y_ppem < 0x18)) {
          (glyph->root).outline.flags = (glyph->root).outline.flags | 0x100;
        }
        (glyph->root).outline.flags = (glyph->root).outline.flags | 4;
        if ((((font_offset.y != 0x10000) || (font_matrix.yx != 0x10000)) || (font_matrix.xx != 0))
           || (font_matrix.xy != 0)) {
          FT_Outline_Transform(&(glyph->root).outline,(FT_Matrix *)&font_offset.y);
          FVar8 = FT_MulFix_x86_64((FT_Int32)_vertBearingY->horiAdvance,(FT_Int32)font_offset.y);
          _vertBearingY->horiAdvance = (long)FVar8;
          FVar8 = FT_MulFix_x86_64((FT_Int32)_vertBearingY->vertAdvance,(FT_Int32)font_matrix.yx);
          _vertBearingY->vertAdvance = (long)FVar8;
        }
        if ((cff_face != (CFF_Face)0x0) || (font_offset.x != 0)) {
          FT_Outline_Translate(&(glyph->root).outline,(FT_Pos)cff_face,font_offset.x);
          _vertBearingY->horiAdvance =
               (long)&(cff_face->root).num_faces + _vertBearingY->horiAdvance;
          _vertBearingY->vertAdvance = font_offset.x + _vertBearingY->vertAdvance;
        }
        if (((local_28 & 1) == 0) || (bVar13)) {
          x_scale = (FT_Fixed)(glyph->root).outline.points;
          FVar8 = (FT_Int32)glyph->x_scale;
          b = (FT_Int32)glyph->y_scale;
          if ((!cff._7_1_) || (decoder.builder._128_8_ == 0)) {
            for (cur._0_4_ = (int)(glyph->root).outline.n_points; 0 < (int)cur;
                cur._0_4_ = (int)cur + -1) {
              FVar9 = FT_MulFix_x86_64((FT_Int32)*(undefined8 *)x_scale,FVar8);
              *(long *)x_scale = (long)FVar9;
              FVar9 = FT_MulFix_x86_64((FT_Int32)*(undefined8 *)(x_scale + 8),b);
              *(long *)(x_scale + 8) = (long)FVar9;
              x_scale = x_scale + 0x10;
            }
          }
          FVar8 = FT_MulFix_x86_64((FT_Int32)_vertBearingY->horiAdvance,FVar8);
          _vertBearingY->horiAdvance = (long)FVar8;
          FVar8 = FT_MulFix_x86_64((FT_Int32)_vertBearingY->vertAdvance,b);
          _vertBearingY->vertAdvance = (long)FVar8;
        }
        FT_Outline_Get_CBox(&(glyph->root).outline,(FT_BBox *)&metrics_2);
        _vertBearingY->width = cbox.yMin - (long)metrics_2;
        _vertBearingY->height = cbox.xMax - cbox.xMin;
        _vertBearingY->horiBearingX = (FT_Pos)metrics_2;
        _vertBearingY->horiBearingY = cbox.xMax;
        if (vertAdvance._1_1_ == '\0') {
          if ((local_28 & 0x10) != 0) {
            ft_synthesize_vertical_metrics(_vertBearingY,_vertBearingY->vertAdvance);
          }
        }
        else {
          _vertBearingY->vertBearingX = _vertBearingY->horiBearingX - _vertBearingY->horiAdvance / 2
          ;
        }
      }
      else {
        pFVar6 = (glyph->root).internal;
        (glyph->root).metrics.horiBearingX = decoder.builder.pos_y;
        (glyph->root).metrics.horiAdvance = decoder.flex_vectors[6].y;
        (pFVar6->glyph_matrix).xx = font_offset.y;
        (pFVar6->glyph_matrix).xy = font_matrix.xx;
        (pFVar6->glyph_matrix).yx = font_matrix.xy;
        (pFVar6->glyph_matrix).yy = font_matrix.yx;
        (pFVar6->glyph_delta).x = (FT_Pos)cff_face;
        (pFVar6->glyph_delta).y = font_offset.x;
        pFVar6->glyph_transformed = '\x01';
      }
    }
    glyph_local._4_4_ = decoder.free_glyph_callback._4_4_;
  }
  else {
    glyph_local._4_4_ = 6;
  }
  return glyph_local._4_4_;
}

Assistant:

FT_LOCAL_DEF( FT_Error )
  cff_slot_load( CFF_GlyphSlot  glyph,
                 CFF_Size       size,
                 FT_UInt        glyph_index,
                 FT_Int32       load_flags )
  {
    FT_Error     error;
    CFF_Decoder  decoder;
    PS_Decoder   psdecoder;
    TT_Face      face = (TT_Face)glyph->root.face;
    FT_Bool      hinting, scaled, force_scaling;
    CFF_Font     cff  = (CFF_Font)face->extra.data;

    PSAux_Service            psaux         = (PSAux_Service)face->psaux;
    const CFF_Decoder_Funcs  decoder_funcs = psaux->cff_decoder_funcs;

    FT_Matrix    font_matrix;
    FT_Vector    font_offset;


    force_scaling = FALSE;

    /* in a CID-keyed font, consider `glyph_index' as a CID and map */
    /* it immediately to the real glyph_index -- if it isn't a      */
    /* subsetted font, glyph_indices and CIDs are identical, though */
    if ( cff->top_font.font_dict.cid_registry != 0xFFFFU &&
         cff->charset.cids                               )
    {
      /* don't handle CID 0 (.notdef) which is directly mapped to GID 0 */
      if ( glyph_index != 0 )
      {
        glyph_index = cff_charset_cid_to_gindex( &cff->charset,
                                                 glyph_index );
        if ( glyph_index == 0 )
          return FT_THROW( Invalid_Argument );
      }
    }
    else if ( glyph_index >= cff->num_glyphs )
      return FT_THROW( Invalid_Argument );

    if ( load_flags & FT_LOAD_NO_RECURSE )
      load_flags |= FT_LOAD_NO_SCALE | FT_LOAD_NO_HINTING;

    glyph->x_scale = 0x10000L;
    glyph->y_scale = 0x10000L;
    if ( size )
    {
      glyph->x_scale = size->root.metrics.x_scale;
      glyph->y_scale = size->root.metrics.y_scale;
    }

#ifdef TT_CONFIG_OPTION_EMBEDDED_BITMAPS

    /* try to load embedded bitmap if any              */
    /*                                                 */
    /* XXX: The convention should be emphasized in     */
    /*      the documents because it can be confusing. */
    if ( size )
    {
      CFF_Face      cff_face = (CFF_Face)size->root.face;
      SFNT_Service  sfnt     = (SFNT_Service)cff_face->sfnt;
      FT_Stream     stream   = cff_face->root.stream;


      if ( size->strike_index != 0xFFFFFFFFUL      &&
           sfnt->load_eblc                         &&
           ( load_flags & FT_LOAD_NO_BITMAP ) == 0 )
      {
        TT_SBit_MetricsRec  metrics;


        error = sfnt->load_sbit_image( face,
                                       size->strike_index,
                                       glyph_index,
                                       (FT_UInt)load_flags,
                                       stream,
                                       &glyph->root.bitmap,
                                       &metrics );

        if ( !error )
        {
          FT_Bool    has_vertical_info;
          FT_UShort  advance;
          FT_Short   dummy;


          glyph->root.outline.n_points   = 0;
          glyph->root.outline.n_contours = 0;

          glyph->root.metrics.width  = (FT_Pos)metrics.width  << 6;
          glyph->root.metrics.height = (FT_Pos)metrics.height << 6;

          glyph->root.metrics.horiBearingX = (FT_Pos)metrics.horiBearingX << 6;
          glyph->root.metrics.horiBearingY = (FT_Pos)metrics.horiBearingY << 6;
          glyph->root.metrics.horiAdvance  = (FT_Pos)metrics.horiAdvance  << 6;

          glyph->root.metrics.vertBearingX = (FT_Pos)metrics.vertBearingX << 6;
          glyph->root.metrics.vertBearingY = (FT_Pos)metrics.vertBearingY << 6;
          glyph->root.metrics.vertAdvance  = (FT_Pos)metrics.vertAdvance  << 6;

          glyph->root.format = FT_GLYPH_FORMAT_BITMAP;

          if ( load_flags & FT_LOAD_VERTICAL_LAYOUT )
          {
            glyph->root.bitmap_left = metrics.vertBearingX;
            glyph->root.bitmap_top  = metrics.vertBearingY;
          }
          else
          {
            glyph->root.bitmap_left = metrics.horiBearingX;
            glyph->root.bitmap_top  = metrics.horiBearingY;
          }

          /* compute linear advance widths */

          (void)( (SFNT_Service)face->sfnt )->get_metrics( face, 0,
                                                           glyph_index,
                                                           &dummy,
                                                           &advance );
          glyph->root.linearHoriAdvance = advance;

          has_vertical_info = FT_BOOL(
                                face->vertical_info                   &&
                                face->vertical.number_Of_VMetrics > 0 );

          /* get the vertical metrics from the vmtx table if we have one */
          if ( has_vertical_info )
          {
            (void)( (SFNT_Service)face->sfnt )->get_metrics( face, 1,
                                                             glyph_index,
                                                             &dummy,
                                                             &advance );
            glyph->root.linearVertAdvance = advance;
          }
          else
          {
            /* make up vertical ones */
            if ( face->os2.version != 0xFFFFU )
              glyph->root.linearVertAdvance = (FT_Pos)
                ( face->os2.sTypoAscender - face->os2.sTypoDescender );
            else
              glyph->root.linearVertAdvance = (FT_Pos)
                ( face->horizontal.Ascender - face->horizontal.Descender );
          }

          return error;
        }
      }
    }

#endif /* TT_CONFIG_OPTION_EMBEDDED_BITMAPS */

    /* return immediately if we only want the embedded bitmaps */
    if ( load_flags & FT_LOAD_SBITS_ONLY )
      return FT_THROW( Invalid_Argument );

    /* if we have a CID subfont, use its matrix (which has already */
    /* been multiplied with the root matrix)                       */

    /* this scaling is only relevant if the PS hinter isn't active */
    if ( cff->num_subfonts )
    {
      FT_Long  top_upm, sub_upm;
      FT_Byte  fd_index = cff_fd_select_get( &cff->fd_select,
                                             glyph_index );


      if ( fd_index >= cff->num_subfonts )
        fd_index = (FT_Byte)( cff->num_subfonts - 1 );

      top_upm = (FT_Long)cff->top_font.font_dict.units_per_em;
      sub_upm = (FT_Long)cff->subfonts[fd_index]->font_dict.units_per_em;


      font_matrix = cff->subfonts[fd_index]->font_dict.font_matrix;
      font_offset = cff->subfonts[fd_index]->font_dict.font_offset;

      if ( top_upm != sub_upm )
      {
        glyph->x_scale = FT_MulDiv( glyph->x_scale, top_upm, sub_upm );
        glyph->y_scale = FT_MulDiv( glyph->y_scale, top_upm, sub_upm );

        force_scaling = TRUE;
      }
    }
    else
    {
      font_matrix = cff->top_font.font_dict.font_matrix;
      font_offset = cff->top_font.font_dict.font_offset;
    }

    glyph->root.outline.n_points   = 0;
    glyph->root.outline.n_contours = 0;

    /* top-level code ensures that FT_LOAD_NO_HINTING is set */
    /* if FT_LOAD_NO_SCALE is active                         */
    hinting = FT_BOOL( ( load_flags & FT_LOAD_NO_HINTING ) == 0 );
    scaled  = FT_BOOL( ( load_flags & FT_LOAD_NO_SCALE   ) == 0 );

    glyph->hint        = hinting;
    glyph->scaled      = scaled;
    glyph->root.format = FT_GLYPH_FORMAT_OUTLINE;  /* by default */

    {
#ifdef CFF_CONFIG_OPTION_OLD_ENGINE
      PS_Driver  driver = (PS_Driver)FT_FACE_DRIVER( face );
#endif


      FT_Byte*  charstring;
      FT_ULong  charstring_len;


      decoder_funcs->init( &decoder, face, size, glyph, hinting,
                           FT_LOAD_TARGET_MODE( load_flags ),
                           cff_get_glyph_data,
                           cff_free_glyph_data );

      /* this is for pure CFFs */
      if ( load_flags & FT_LOAD_ADVANCE_ONLY )
        decoder.width_only = TRUE;

      decoder.builder.no_recurse =
        (FT_Bool)( load_flags & FT_LOAD_NO_RECURSE );

      /* now load the unscaled outline */
      error = cff_get_glyph_data( face, glyph_index,
                                  &charstring, &charstring_len );
      if ( error )
        goto Glyph_Build_Finished;

      error = decoder_funcs->prepare( &decoder, size, glyph_index );
      if ( error )
        goto Glyph_Build_Finished;

#ifdef CFF_CONFIG_OPTION_OLD_ENGINE
      /* choose which CFF renderer to use */
      if ( driver->hinting_engine == FT_HINTING_FREETYPE )
        error = decoder_funcs->parse_charstrings_old( &decoder,
                                                      charstring,
                                                      charstring_len,
                                                      0 );
      else
#endif
      {
        psaux->ps_decoder_init( &psdecoder, &decoder, FALSE );

        error = decoder_funcs->parse_charstrings( &psdecoder,
                                                  charstring,
                                                  charstring_len );

        /* Adobe's engine uses 16.16 numbers everywhere;              */
        /* as a consequence, glyphs larger than 2000ppem get rejected */
        if ( FT_ERR_EQ( error, Glyph_Too_Big ) )
        {
          /* this time, we retry unhinted and scale up the glyph later on */
          /* (the engine uses and sets the hardcoded value 0x10000 / 64 = */
          /* 0x400 for both `x_scale' and `y_scale' in this case)         */
          hinting       = FALSE;
          force_scaling = TRUE;
          glyph->hint   = hinting;

          error = decoder_funcs->parse_charstrings( &psdecoder,
                                                    charstring,
                                                    charstring_len );
        }
      }

      cff_free_glyph_data( face, &charstring, charstring_len );

      if ( error )
        goto Glyph_Build_Finished;

#ifdef FT_CONFIG_OPTION_INCREMENTAL
      /* Control data and length may not be available for incremental */
      /* fonts.                                                       */
      if ( face->root.internal->incremental_interface )
      {
        glyph->root.control_data = NULL;
        glyph->root.control_len = 0;
      }
      else
#endif /* FT_CONFIG_OPTION_INCREMENTAL */

      /* We set control_data and control_len if charstrings is loaded. */
      /* See how charstring loads at cff_index_access_element() in     */
      /* cffload.c.                                                    */
      {
        CFF_Index  csindex = &cff->charstrings_index;


        if ( csindex->offsets )
        {
          glyph->root.control_data = csindex->bytes +
                                     csindex->offsets[glyph_index] - 1;
          glyph->root.control_len  = (FT_Long)charstring_len;
        }
      }

  Glyph_Build_Finished:
      /* save new glyph tables, if no error */
      if ( !error )
        decoder.builder.funcs.done( &decoder.builder );
      /* XXX: anything to do for broken glyph entry? */
    }

#ifdef FT_CONFIG_OPTION_INCREMENTAL

    /* Incremental fonts can optionally override the metrics. */
    if ( !error                                                               &&
         face->root.internal->incremental_interface                           &&
         face->root.internal->incremental_interface->funcs->get_glyph_metrics )
    {
      FT_Incremental_MetricsRec  metrics;


      metrics.bearing_x = decoder.builder.left_bearing.x;
      metrics.bearing_y = 0;
      metrics.advance   = decoder.builder.advance.x;
      metrics.advance_v = decoder.builder.advance.y;

      error = face->root.internal->incremental_interface->funcs->get_glyph_metrics(
                face->root.internal->incremental_interface->object,
                glyph_index, FALSE, &metrics );

      decoder.builder.left_bearing.x = metrics.bearing_x;
      decoder.builder.advance.x      = metrics.advance;
      decoder.builder.advance.y      = metrics.advance_v;
    }

#endif /* FT_CONFIG_OPTION_INCREMENTAL */

    if ( !error )
    {
      /* Now, set the metrics -- this is rather simple, as   */
      /* the left side bearing is the xMin, and the top side */
      /* bearing the yMax.                                   */

      /* For composite glyphs, return only left side bearing and */
      /* advance width.                                          */
      if ( load_flags & FT_LOAD_NO_RECURSE )
      {
        FT_Slot_Internal  internal = glyph->root.internal;


        glyph->root.metrics.horiBearingX = decoder.builder.left_bearing.x;
        glyph->root.metrics.horiAdvance  = decoder.glyph_width;
        internal->glyph_matrix           = font_matrix;
        internal->glyph_delta            = font_offset;
        internal->glyph_transformed      = 1;
      }
      else
      {
        FT_BBox            cbox;
        FT_Glyph_Metrics*  metrics = &glyph->root.metrics;
        FT_Bool            has_vertical_info;


        if ( face->horizontal.number_Of_HMetrics )
        {
          FT_Short   horiBearingX = 0;
          FT_UShort  horiAdvance  = 0;


          ( (SFNT_Service)face->sfnt )->get_metrics( face, 0,
                                                     glyph_index,
                                                     &horiBearingX,
                                                     &horiAdvance );
          metrics->horiAdvance          = horiAdvance;
          metrics->horiBearingX         = horiBearingX;
          glyph->root.linearHoriAdvance = horiAdvance;
        }
        else
        {
          /* copy the _unscaled_ advance width */
          metrics->horiAdvance          = decoder.glyph_width;
          glyph->root.linearHoriAdvance = decoder.glyph_width;
        }

        glyph->root.internal->glyph_transformed = 0;

        has_vertical_info = FT_BOOL( face->vertical_info                   &&
                                     face->vertical.number_Of_VMetrics > 0 );

        /* get the vertical metrics from the vmtx table if we have one */
        if ( has_vertical_info )
        {
          FT_Short   vertBearingY = 0;
          FT_UShort  vertAdvance  = 0;


          ( (SFNT_Service)face->sfnt )->get_metrics( face, 1,
                                                     glyph_index,
                                                     &vertBearingY,
                                                     &vertAdvance );
          metrics->vertBearingY = vertBearingY;
          metrics->vertAdvance  = vertAdvance;
        }
        else
        {
          /* make up vertical ones */
          if ( face->os2.version != 0xFFFFU )
            metrics->vertAdvance = (FT_Pos)( face->os2.sTypoAscender -
                                             face->os2.sTypoDescender );
          else
            metrics->vertAdvance = (FT_Pos)( face->horizontal.Ascender -
                                             face->horizontal.Descender );
        }

        glyph->root.linearVertAdvance = metrics->vertAdvance;

        glyph->root.format = FT_GLYPH_FORMAT_OUTLINE;

        glyph->root.outline.flags = 0;
        if ( size && size->root.metrics.y_ppem < 24 )
          glyph->root.outline.flags |= FT_OUTLINE_HIGH_PRECISION;

        glyph->root.outline.flags |= FT_OUTLINE_REVERSE_FILL;

        /* apply the font matrix, if any */
        if ( font_matrix.xx != 0x10000L || font_matrix.yy != 0x10000L ||
             font_matrix.xy != 0        || font_matrix.yx != 0        )
        {
          FT_Outline_Transform( &glyph->root.outline, &font_matrix );

          metrics->horiAdvance = FT_MulFix( metrics->horiAdvance,
                                            font_matrix.xx );
          metrics->vertAdvance = FT_MulFix( metrics->vertAdvance,
                                            font_matrix.yy );
        }

        if ( font_offset.x || font_offset.y )
        {
          FT_Outline_Translate( &glyph->root.outline,
                                font_offset.x,
                                font_offset.y );

          metrics->horiAdvance += font_offset.x;
          metrics->vertAdvance += font_offset.y;
        }

        if ( ( load_flags & FT_LOAD_NO_SCALE ) == 0 || force_scaling )
        {
          /* scale the outline and the metrics */
          FT_Int       n;
          FT_Outline*  cur     = &glyph->root.outline;
          FT_Vector*   vec     = cur->points;
          FT_Fixed     x_scale = glyph->x_scale;
          FT_Fixed     y_scale = glyph->y_scale;


          /* First of all, scale the points */
          if ( !hinting || !decoder.builder.hints_funcs )
            for ( n = cur->n_points; n > 0; n--, vec++ )
            {
              vec->x = FT_MulFix( vec->x, x_scale );
              vec->y = FT_MulFix( vec->y, y_scale );
            }

          /* Then scale the metrics */
          metrics->horiAdvance = FT_MulFix( metrics->horiAdvance, x_scale );
          metrics->vertAdvance = FT_MulFix( metrics->vertAdvance, y_scale );
        }

        /* compute the other metrics */
        FT_Outline_Get_CBox( &glyph->root.outline, &cbox );

        metrics->width  = cbox.xMax - cbox.xMin;
        metrics->height = cbox.yMax - cbox.yMin;

        metrics->horiBearingX = cbox.xMin;
        metrics->horiBearingY = cbox.yMax;

        if ( has_vertical_info )
          metrics->vertBearingX = metrics->horiBearingX -
                                    metrics->horiAdvance / 2;
        else
        {
          if ( load_flags & FT_LOAD_VERTICAL_LAYOUT )
            ft_synthesize_vertical_metrics( metrics,
                                            metrics->vertAdvance );
        }
      }
    }

    return error;
  }